

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O0

void __thiscall phmap::priv::anon_unknown_0::Table_Merge_Test::TestBody(Table_Merge_Test *this)

{
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  matcher;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  matcher_00;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  matcher_01;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  matcher_02;
  bool bVar1;
  char *pcVar2;
  PairMatcher<const_char_*,_const_char_*> *in_R8;
  char *in_stack_fffffffffffffc68;
  char *in_stack_fffffffffffffc78;
  AssertHelper local_2e0;
  Message local_2d8;
  PairMatcher<const_char_*,_const_char_*> local_2d0;
  testing local_2c0 [8];
  char *pcStack_2b8;
  char local_2b0 [16];
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_3;
  Message local_288;
  PairMatcher<const_char_*,_const_char_*> local_280;
  PairMatcher<const_char_*,_const_char_*> local_270;
  PairMatcher<const_char_*,_const_char_*> local_260;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  local_250;
  char local_220 [48];
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_2;
  Message local_1d8;
  PairMatcher<const_char_*,_const_char_*> local_1d0;
  PairMatcher<const_char_*,_const_char_*> local_1c0;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  local_1b0;
  char local_190 [32];
  undefined1 local_170 [8];
  AssertionResult gtest_ar_1;
  Message local_158;
  PairMatcher<const_char_*,_const_char_*> local_150;
  PairMatcher<const_char_*,_const_char_*> local_140;
  UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>_>
  local_130;
  char local_110 [32];
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_bool>
  local_c8;
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_bool>
  local_b0;
  pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_bool>
  local_98;
  undefined1 local_70 [8];
  StringTable t2;
  StringTable t1;
  Table_Merge_Test *this_local;
  
  StringTable::StringTable
            ((StringTable *)
             &t2.
              super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              .settings_);
  StringTable::StringTable((StringTable *)local_70);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::emplace<const_char_(&)[2],_const_char_(&)[3],_0>
            (&local_98,
             (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)&t2.
                 super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                 .settings_,(char (*) [2])0x220639,(char (*) [3])"-0");
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::emplace<const_char_(&)[2],_const_char_(&)[3],_0>
            (&local_b0,
             (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)&t2.
                 super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                 .settings_,(char (*) [2])0x211bc8,(char (*) [3])0x21eae4);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::emplace<const_char_(&)[2],_const_char_(&)[3],_0>
            (&local_c8,
             (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)local_70,(char (*) [2])0x220639,(char (*) [3])"~0");
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
  ::emplace<const_char_(&)[2],_const_char_(&)[3],_0>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>::iterator,_bool>
              *)&gtest_ar.message_,
             (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)local_70,(char (*) [2])0x2125cc,(char (*) [3])"~2");
  local_140 = testing::Pair<char_const*,char_const*>("0","-0");
  local_150 = testing::Pair<char_const*,char_const*>("1","-1");
  testing::
  UnorderedElementsAre<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>
            (&local_130,(testing *)&local_140,&local_150,
             (PairMatcher<const_char_*,_const_char_*> *)local_150.first_matcher_);
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ =
       local_130.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.first_matcher_;
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_130.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
       super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_130.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_00.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ = in_stack_fffffffffffffc68;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
            (matcher_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_f0,local_110,(StringTable *)0x211699);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    in_R8 = (PairMatcher<const_char_*,_const_char_*> *)
            testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6ab,(char *)in_R8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  local_1c0 = testing::Pair<char_const*,char_const*>("0","~0");
  local_1d0 = testing::Pair<char_const*,char_const*>("2","~2");
  testing::
  UnorderedElementsAre<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>
            (&local_1b0,(testing *)&local_1c0,&local_1d0,
             (PairMatcher<const_char_*,_const_char_*> *)local_1d0.first_matcher_);
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ =
       local_1b0.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.first_matcher_;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_1b0.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
       super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_1b0.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_01.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ = in_stack_fffffffffffffc68;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
            (matcher_01);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_170,local_190,(StringTable *)0x2116a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    in_R8 = (PairMatcher<const_char_*,_const_char_*> *)
            testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6ac,(char *)in_R8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
  ::
  merge<phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq>
            ((raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,phmap::priv::(anonymous_namespace)::StringHash,phmap::priv::(anonymous_namespace)::StringEq,std::allocator<int>>
              *)&t2.
                 super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
                 .settings_,
             (raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              *)local_70);
  local_260 = testing::Pair<char_const*,char_const*>("0","-0");
  local_270 = testing::Pair<char_const*,char_const*>("1","-1");
  local_280 = testing::Pair<char_const*,char_const*>("2","~2");
  testing::
  UnorderedElementsAre<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>
            (&local_250,(testing *)&local_260,&local_270,&local_280,in_R8);
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .
  super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<2UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<2UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ =
       local_250.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .
       super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.first_matcher_;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .
  super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Tuple_impl<2UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<2UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_250.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .
       super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Tuple_impl<2UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
       super__Head_base<2UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .
  super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_250.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .
       super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .
  super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ =
       local_250.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.first_matcher_;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ =
       local_250.matchers_.
       super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
       .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
       _M_head_impl.second_matcher_;
  matcher_02.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
  .super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ = in_stack_fffffffffffffc78;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
            (matcher_02);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>,testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_1f0,local_220,(StringTable *)0x211699);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  pcVar2 = local_250.matchers_.
           super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
           .
           super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
           .super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>
           ._M_head_impl.first_matcher_;
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6b0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_288);
    pcVar2 = local_250.matchers_.
             super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
             .
             super__Tuple_impl<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>
             .
             super__Head_base<1UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>
             ._M_head_impl.first_matcher_;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  local_2d0 = testing::Pair<char_const*,char_const*>("0","~0");
  testing::UnorderedElementsAre<testing::internal::PairMatcher<char_const*,char_const*>>
            (local_2c0,&local_2d0);
  matcher.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.second_matcher_ = pcVar2;
  matcher.matchers_.
  super__Tuple_impl<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>_>.
  super__Head_base<0UL,_testing::internal::PairMatcher<const_char_*,_const_char_*>,_false>.
  _M_head_impl.first_matcher_ = pcStack_2b8;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>>>>
            (matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<testing::internal::PairMatcher<char_const*,char_const*>>>>
  ::operator()(local_2a0,local_2b0,(StringTable *)0x2116a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x6b1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e0);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  StringTable::~StringTable((StringTable *)local_70);
  StringTable::~StringTable
            ((StringTable *)
             &t2.
              super_raw_hash_set<phmap::priv::(anonymous_namespace)::StringPolicy,_phmap::priv::(anonymous_namespace)::StringHash,_phmap::priv::(anonymous_namespace)::StringEq,_std::allocator<int>_>
              .settings_);
  return;
}

Assistant:

TEST(Table, Merge) {
  StringTable t1, t2;
  t1.emplace("0", "-0");
  t1.emplace("1", "-1");
  t2.emplace("0", "~0");
  t2.emplace("2", "~2");

  EXPECT_THAT(t1, UnorderedElementsAre(Pair("0", "-0"), Pair("1", "-1")));
  EXPECT_THAT(t2, UnorderedElementsAre(Pair("0", "~0"), Pair("2", "~2")));

  t1.merge(t2);
  EXPECT_THAT(t1, UnorderedElementsAre(Pair("0", "-0"), Pair("1", "-1"),
                                       Pair("2", "~2")));
  EXPECT_THAT(t2, UnorderedElementsAre(Pair("0", "~0")));
}